

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_item.c
# Opt level: O3

TestItem * create_test_item_from(char *specification_name)

{
  TestItem *pTVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  pTVar1 = (TestItem *)malloc(0x18);
  pcVar2 = strdup(specification_name);
  pTVar1->specification_name = pcVar2;
  pcVar5 = specification_name + 0xc;
  pcVar2 = strstr(pcVar5,"__");
  pcVar3 = strdup(pcVar5);
  pcVar3[(long)pcVar2 - (long)pcVar5] = '\0';
  pTVar1->context_name = pcVar3;
  pcVar2 = pcVar2 + 2;
  pcVar3 = strstr(pcVar2,"__");
  if (pcVar3 == (char *)0x0) {
    sVar4 = strlen(pcVar2);
    pcVar3 = pcVar2 + sVar4;
  }
  pcVar5 = strdup(pcVar2);
  pcVar5[(long)pcVar3 - (long)pcVar2] = '\0';
  pTVar1->test_name = pcVar5;
  return pTVar1;
}

Assistant:

TestItem *create_test_item_from(const char *specification_name) {
    TestItem *test_item = (TestItem *)malloc(sizeof(TestItem));

    test_item->specification_name = strdup(specification_name);
    test_item->context_name = context_name_from(specification_name);
    test_item->test_name = test_name_from(specification_name);

    return test_item;
}